

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O0

void __thiscall
HawkTracer::client::CallgrindConverter::_print_function
          (CallgrindConverter *this,ofstream *file,
          shared_ptr<HawkTracer::client::CallGraph::TreeNode> *root)

{
  HT_DurationNs HVar1;
  bool bVar2;
  element_type *peVar3;
  reference this_00;
  ostream *poVar4;
  reference this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [8];
  string child_label;
  pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *child;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  *__range3;
  value_type *fnc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  undefined1 local_70 [8];
  queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  fnc_queue;
  shared_ptr<HawkTracer::client::CallGraph::TreeNode> *root_local;
  ofstream *file_local;
  CallgrindConverter *this_local;
  
  fnc_queue.c.
  super__Deque_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)root;
  std::
  queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>>
  ::
  queue<std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>,void>
            ((queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>>
              *)local_70);
  peVar3 = std::
           __shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)root);
  std::operator+(local_90,(char *)peVar3);
  std::
  queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>>
  ::emplace<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>&,std::__cxx11::string>
            ((queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>>
              *)local_70,root,local_90);
  std::__cxx11::string::~string((string *)local_90);
  while( true ) {
    bVar2 = std::
            queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::empty((queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_70);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    this_00 = std::
              queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::front((queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)local_70);
    poVar4 = std::operator<<((ostream *)file,"fn=");
    poVar4 = std::operator<<(poVar4,(string *)&this_00->second);
    std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<((ostream *)file,"1 ");
    peVar3 = std::
             __shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
    HVar1 = peVar3->total_duration;
    peVar3 = std::
             __shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,HVar1 - peVar3->total_children_duration);
    std::operator<<(poVar4,"\n");
    peVar3 = std::
             __shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
    __end3 = std::
             vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
             ::begin(&peVar3->children);
    child = (pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *)
            std::
            vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
            ::end(&peVar3->children);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
                                  *)&child);
      if (!bVar2) break;
      this_01 = __gnu_cxx::
                __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
                ::operator*(&__end3);
      peVar3 = std::
               __shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this_01);
      std::operator+(local_108,(char *)peVar3);
      std::operator+(local_e8,local_108);
      std::__cxx11::string::~string((string *)local_108);
      poVar4 = std::operator<<((ostream *)file,"cfn=");
      poVar4 = std::operator<<(poVar4,(string *)local_e8);
      std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<((ostream *)file,"calls=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this_01->second);
      std::operator<<(poVar4," 1\n");
      poVar4 = std::operator<<((ostream *)file,"1 ");
      peVar3 = std::
               __shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this_01);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,peVar3->total_duration);
      std::operator<<(poVar4,"\n");
      std::
      queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>>
      ::
      emplace<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::__cxx11::string&>
                ((queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>>
                  *)local_70,&this_01->first,local_e8);
      std::__cxx11::string::~string((string *)local_e8);
      __gnu_cxx::
      __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
      ::operator++(&__end3);
    }
    std::
    queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::pop((queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)local_70);
  }
  std::
  queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~queue((queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)local_70);
  return;
}

Assistant:

void CallgrindConverter::_print_function(std::ofstream& file, std::shared_ptr<CallGraph::TreeNode> root)
{
    std::queue<std::pair<std::shared_ptr<CallGraph::TreeNode>, std::string>> fnc_queue;
    fnc_queue.emplace(root, root->data.label + "()");

    while (!fnc_queue.empty())
    {
        auto& fnc = fnc_queue.front();
        file << "fn=" << fnc.second << "\n";
        file << "1 " << fnc.first->total_duration - fnc.first->total_children_duration << "\n";
        for (const auto& child : fnc.first->children)
        {
            std::string child_label = child.first->data.label + "()'" + fnc.second;
            file << "cfn=" << child_label << "\n";
            file << "calls=" << child.second << " 1\n";
            file << "1 " << child.first->total_duration << "\n";
            fnc_queue.emplace(child.first, child_label);
        }
        fnc_queue.pop();
    }
}